

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int __thiscall
MlmWrap::calculateDeviceChannelInfoIndices
          (MlmWrap *this,vector<int,_std::allocator<int>_> *indices,
          vector<int,_std::allocator<int>_> *startlengths,int startbyte,int bit)

{
  pointer piVar1;
  iterator iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int local_18;
  int local_14;
  
  piVar1 = (startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(startlengths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    uVar5 = 0;
    iVar4 = 0;
    iVar6 = 0;
    do {
      iVar4 = (piVar1[uVar5] - iVar6) + iVar4;
      iVar6 = piVar1[uVar5] + piVar1[uVar5 + 1];
      if (startbyte < iVar6) {
        _local_18 = CONCAT44(startbyte - iVar4,bit);
        iVar2._M_current =
             (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(indices,iVar2,&local_14);
        }
        else {
          *iVar2._M_current = startbyte - iVar4;
          (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        iVar2._M_current =
             (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current !=
            (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          *iVar2._M_current = local_18;
          (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
          return iVar4;
        }
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)indices,iVar2,&local_18);
        return iVar4;
      }
      uVar5 = uVar5 + 2;
    } while (uVar5 < (ulong)(lVar3 >> 2));
  }
  return -1;
}

Assistant:

int MlmWrap::calculateDeviceChannelInfoIndices(std::vector<int> &indices, std::vector<int>& startlengths, int startbyte, int bit){
    //push back index, adjusted for analog's dataformat
    //returns the gap, which when subtracted from startbyte (start byte in trodes packet), returns the startbyte of the actual analog packet
    int prev = 0;
    int gap = 0;
    for(size_t i = 0; i < startlengths.size(); i+=2){
        gap += startlengths[i] - prev;
        prev = startlengths[i] + startlengths[i+1];
        if(startbyte < startlengths[i] + startlengths[i+1]){
            //Channel in this block. subtract total gap
            indices.push_back(startbyte - gap);
            indices.push_back(bit);
            return gap;
        }
    }
    return -1;
}